

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp_json_serializer.h
# Opt level: O0

bool __thiscall
dap::json::JsonCppDeserializer::deserialize<dap::any>(JsonCppDeserializer *this,array<dap::any> *v)

{
  bool bVar1;
  array<dap::any> *v_local;
  JsonCppDeserializer *this_local;
  
  bVar1 = Deserializer::deserialize<dap::any>(&this->super_Deserializer,v);
  return bVar1;
}

Assistant:

inline bool deserialize(dap::array<T>* v) const {
    return dap::Deserializer::deserialize(v);
  }